

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::getAttributeEncodedValue(CFIReaderImpl *this,int idx)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<const_Assimp::FIValue> sVar5;
  
  iVar4 = (int)in_RDX._M_pi;
  if (-1 < iVar4) {
    uVar3 = (ulong)in_RDX._M_pi & 0xffffffff;
    lVar1 = *(long *)(CONCAT44(in_register_00000034,idx) + 0x148);
    lVar2 = *(long *)(CONCAT44(in_register_00000034,idx) + 0x150) - lVar1;
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar2 % 0x90);
    if (iVar4 < (int)(lVar2 / 0x90)) {
      std::__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)
                 (lVar1 + uVar3 * 0x90 + 0x80));
      in_RDX._M_pi = extraout_RDX;
      goto LAB_0053629b;
    }
  }
  (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
       (_func_int **)0x0;
  (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
LAB_0053629b:
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> getAttributeEncodedValue(int idx) const /*override*/ {
        if (idx < 0 || idx >= (int)attributes.size()) {
            return nullptr;
        }
        return attributes[idx].value;
    }